

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Shutdown(void)

{
  ImFontAtlas *pIVar1;
  char *ini_filename;
  ImFileHandle f;
  ImGuiContext *ctx;
  
  ctx = GImGui;
  pIVar1 = (GImGui->IO).Fonts;
  if ((pIVar1 != (ImFontAtlas *)0x0) && (GImGui->FontAtlasOwnedByContext == true)) {
    pIVar1->Locked = false;
    IM_DELETE<ImFontAtlas>((ctx->IO).Fonts);
  }
  (ctx->IO).Fonts = (ImFontAtlas *)0x0;
  ImVector<ImVec2>::clear(&(ctx->DrawListSharedData).TempBuffer);
  if (ctx->Initialized == true) {
    if ((ctx->SettingsLoaded == true) &&
       (ini_filename = (ctx->IO).IniFilename, ini_filename != (char *)0x0)) {
      SaveIniSettingsToDisk(ini_filename);
    }
    CallContextHooks(ctx,ImGuiContextHookType_Shutdown);
    ImVector<ImGuiWindow_*>::clear_delete(&ctx->Windows);
    ImVector<ImGuiWindow_*>::clear(&ctx->WindowsFocusOrder);
    ImVector<ImGuiWindow_*>::clear(&ctx->WindowsTempSortBuffer);
    ctx->CurrentWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiWindowStackData>::clear(&ctx->CurrentWindowStack);
    ImVector<ImGuiStorage::ImGuiStoragePair>::clear(&(ctx->WindowsById).Data);
    ctx->NavWindow = (ImGuiWindow *)0x0;
    ctx->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
    ctx->ActiveIdWindow = (ImGuiWindow *)0x0;
    ctx->HoveredWindow = (ImGuiWindow *)0x0;
    ctx->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    ctx->MovingWindow = (ImGuiWindow *)0x0;
    ImGuiKeyRoutingTable::Clear(&ctx->KeysRoutingTable);
    ImVector<ImGuiColorMod>::clear(&ctx->ColorStack);
    ImVector<ImGuiStyleMod>::clear(&ctx->StyleVarStack);
    ImVector<ImFont_*>::clear(&ctx->FontStack);
    ImVector<ImGuiPopupData>::clear(&ctx->OpenPopupStack);
    ImVector<ImGuiPopupData>::clear(&ctx->BeginPopupStack);
    ImVector<ImGuiViewportP_*>::clear_delete(&ctx->Viewports);
    ImPool<ImGuiTabBar>::Clear(&ctx->TabBars);
    ImVector<ImGuiPtrOrIndex>::clear(&ctx->CurrentTabBarStack);
    ImVector<ImGuiShrinkWidthItem>::clear(&ctx->ShrinkWidthBuffer);
    ImVector<ImGuiListClipperData>::clear_destruct(&ctx->ClipperTempData);
    ImPool<ImGuiTable>::Clear(&ctx->Tables);
    ImVector<ImGuiTableTempData>::clear_destruct(&ctx->TablesTempData);
    ImVector<ImDrawChannel>::clear(&ctx->DrawChannelsTempMergeBuffer);
    ImVector<char>::clear(&ctx->ClipboardHandlerData);
    ImVector<unsigned_int>::clear(&ctx->MenusIdSubmittedThisFrame);
    ImGuiInputTextState::ClearFreeMemory(&ctx->InputTextState);
    ImVector<char>::clear(&(ctx->SettingsWindows).Buf);
    ImVector<ImGuiSettingsHandler>::clear(&ctx->SettingsHandlers);
    f = ctx->LogFile;
    if (f != (ImFileHandle)0x0) {
      if (f != _stdout) {
        ImFileClose(f);
      }
      ctx->LogFile = (ImFileHandle)0x0;
    }
    ImVector<char>::clear(&(ctx->LogBuffer).Buf);
    ImVector<char>::clear(&(ctx->DebugLogBuf).Buf);
    ImGuiTextIndex::clear(&ctx->DebugLogIndex);
    ctx->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown()
{
    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    ImGuiContext& g = *GImGui;
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
    {
        g.IO.Fonts->Locked = false;
        IM_DELETE(g.IO.Fonts);
    }
    g.IO.Fonts = NULL;
    g.DrawListSharedData.TempBuffer.clear();

    // Cleanup of other data are conditional on actually having initialized Dear ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded && g.IO.IniFilename != NULL)
        SaveIniSettingsToDisk(g.IO.IniFilename);

    CallContextHooks(&g, ImGuiContextHookType_Shutdown);

    // Clear everything else
    g.Windows.clear_delete();
    g.WindowsFocusOrder.clear();
    g.WindowsTempSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;
    g.ActiveIdWindow = g.ActiveIdPreviousFrameWindow = NULL;
    g.MovingWindow = NULL;

    g.KeysRoutingTable.Clear();

    g.ColorStack.clear();
    g.StyleVarStack.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.BeginPopupStack.clear();

    g.Viewports.clear_delete();

    g.TabBars.Clear();
    g.CurrentTabBarStack.clear();
    g.ShrinkWidthBuffer.clear();

    g.ClipperTempData.clear_destruct();

    g.Tables.Clear();
    g.TablesTempData.clear_destruct();
    g.DrawChannelsTempMergeBuffer.clear();

    g.ClipboardHandlerData.clear();
    g.MenusIdSubmittedThisFrame.clear();
    g.InputTextState.ClearFreeMemory();

    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile)
    {
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        if (g.LogFile != stdout)
#endif
            ImFileClose(g.LogFile);
        g.LogFile = NULL;
    }
    g.LogBuffer.clear();
    g.DebugLogBuf.clear();
    g.DebugLogIndex.clear();

    g.Initialized = false;
}